

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::BP5Writer::BeginStep(BP5Writer *this,StepMode mode,float timeoutSeconds)

{
  Comm *this_00;
  double dVar1;
  int iVar2;
  long lVar3;
  AttrMap *pAVar4;
  long lVar5;
  ostream *poVar6;
  ChunkV *this_01;
  MallocV *this_02;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Hash_node_base *p_Var9;
  undefined4 in_XMM0_Db;
  double dVar10;
  string local_138;
  double local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)CONCAT44(in_XMM0_Db,timeoutSeconds),&local_138,"Engine","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"BP5Writer","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"BeginStep","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "BeginStep() is called a second time without an intervening EndStep()","");
    helper::Throw<std::logic_error>(&local_138,&local_90,&local_b0,&local_d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
  }
  std::chrono::_V2::steady_clock::now();
  (this->super_Engine).m_BetweenStepPairs = true;
  if (this->m_IsFirstStep == false) {
    lVar3 = std::chrono::_V2::steady_clock::now();
    dVar10 = ((double)lVar3 - (this->m_EndStepEnd).__d.__r) / 1000000000.0;
    (this->m_LastTimeBetweenSteps).__r = dVar10;
    dVar10 = dVar10 + (this->m_TotalTimeBetweenSteps).__r;
    (this->m_TotalTimeBetweenSteps).__r = dVar10;
    dVar10 = dVar10 / (double)this->m_WriterStep;
    (this->m_AvgTimeBetweenSteps).__r = dVar10;
    dVar1 = (this->m_LastTimeBetweenSteps).__r;
    (this->m_ExpectedTimeBetweenSteps).__r = dVar1;
    if (dVar10 < dVar1) {
      (this->m_ExpectedTimeBetweenSteps).__r = (this->m_AvgTimeBetweenSteps).__r;
    }
  }
  if ((this->m_IsFirstStep == true) &&
     ((this->super_BP5Engine).m_Parameters.UseOneTimeAttributes == true)) {
    pAVar4 = IO::GetAttributes_abi_cxx11_((this->super_Engine).m_IO);
    p_Var9 = (pAVar4->_M_h)._M_before_begin._M_nxt;
    if (p_Var9 != (_Hash_node_base *)0x0) {
      do {
        adios2::format::BP5Serializer::OnetimeMarshalAttribute
                  (&this->m_BP5Serializer,(AttributeBase *)p_Var9[5]._M_nxt);
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    this->m_MarshalAttributesNecessary = false;
  }
  this->m_IsFirstStep = false;
  if ((this->super_BP5Engine).m_Parameters.AsyncWrite != 0) {
    shm::Spinlock::lock(&this->m_AsyncWriteLock);
    this->m_flagRush = true;
    shm::Spinlock::unlock(&this->m_AsyncWriteLock);
    lVar3 = std::chrono::_V2::steady_clock::now();
    if ((this->m_WriteFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BS_WaitOnAsync","");
      profiling::JSONProfiler::Start(&this->m_Profiler,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::future<int>::get(&this->m_WriteFuture);
      this_00 = &(this->super_Engine).m_Comm;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      helper::Comm::Barrier(this_00,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      AsyncWriteDataCleanup(this);
      lVar5 = std::chrono::_V2::steady_clock::now();
      iVar2 = helper::Comm::Rank(this_00);
      if (iVar2 == 0) {
        WriteMetadataFileIndex(this,this->m_LatestMetaDataPos,this->m_LatestMetaDataSize);
        if (0 < (this->super_BP5Engine).m_Parameters.verbose) {
          local_118 = ((double)lVar5 - (double)lVar3) / 1000000000.0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"BeginStep, wait on async write was = ",0x25);
          poVar6 = std::ostream::_M_insert<double>(local_118);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," time since EndStep was = ",0x1a);
          poVar6 = std::ostream::_M_insert<double>((this->m_LastTimeBetweenSteps).__r);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," expect next one to be = ",0x19);
          poVar6 = std::ostream::_M_insert<double>((this->m_ExpectedTimeBetweenSteps).__r);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BS_WaitOnAsync","");
      profiling::JSONProfiler::Stop(&this->m_Profiler,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  if ((this->super_BP5Engine).m_Parameters.BufferVType == 0) {
    this_02 = (MallocV *)operator_new(0xa0);
    paVar8 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"BP5Writer","");
    adios2::format::MallocV::MallocV
              (this_02,&local_f0,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.InitialBufferSize,
               (double)(this->super_BP5Engine).m_Parameters.GrowthFactor);
    adios2::format::BP5Serializer::InitStep(&this->m_BP5Serializer,(BufferV *)this_02);
    _Var7._M_p = local_f0._M_dataplus._M_p;
  }
  else {
    this_01 = (ChunkV *)operator_new(0xb0);
    paVar8 = &local_110.field_2;
    local_110._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"BP5Writer","");
    adios2::format::ChunkV::ChunkV
              (this_01,&local_110,false,(this->m_BP5Serializer).m_BufferAlign,
               (this->m_BP5Serializer).m_BufferBlockSize,
               (this->super_BP5Engine).m_Parameters.BufferChunkSize);
    adios2::format::BP5Serializer::InitStep(&this->m_BP5Serializer,(BufferV *)this_01);
    _Var7._M_p = local_110._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar8) {
    operator_delete(_Var7._M_p);
  }
  this->m_ThisTimestepDataSize = 0;
  std::chrono::_V2::steady_clock::now();
  return OK;
}

Assistant:

StepStatus BP5Writer::BeginStep(StepMode mode, const float timeoutSeconds)
{
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP5Writer", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    Seconds ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP starts at: " << ts.count() << std::endl;
    m_BetweenStepPairs = true;

    if (!m_IsFirstStep)
    {
        m_LastTimeBetweenSteps = Now() - m_EndStepEnd;
        m_TotalTimeBetweenSteps += m_LastTimeBetweenSteps;
        m_AvgTimeBetweenSteps = m_TotalTimeBetweenSteps / m_WriterStep;
        m_ExpectedTimeBetweenSteps = m_LastTimeBetweenSteps;
        if (m_ExpectedTimeBetweenSteps > m_AvgTimeBetweenSteps)
        {
            m_ExpectedTimeBetweenSteps = m_AvgTimeBetweenSteps;
        }
    }

    if (m_IsFirstStep && m_Parameters.UseOneTimeAttributes)
    {
        const auto &attributes = m_IO.GetAttributes();

        for (const auto &attributePair : attributes)
        {
            m_BP5Serializer.OnetimeMarshalAttribute(*(attributePair.second));
        }
        m_MarshalAttributesNecessary = false;
    }

    // one-time stuff after Open must be done above
    m_IsFirstStep = false;

    if (m_Parameters.AsyncWrite)
    {
        m_AsyncWriteLock.lock();
        m_flagRush = true;
        m_AsyncWriteLock.unlock();
        TimePoint wait_start = Now();
        if (m_WriteFuture.valid())
        {
            m_Profiler.Start("BS_WaitOnAsync");
            m_WriteFuture.get();
            m_Comm.Barrier();
            AsyncWriteDataCleanup();
            Seconds wait = Now() - wait_start;
            if (m_Comm.Rank() == 0)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
                if (m_Parameters.verbose > 0)
                {
                    std::cout << "BeginStep, wait on async write was = " << wait.count()
                              << " time since EndStep was = " << m_LastTimeBetweenSteps.count()
                              << " expect next one to be = " << m_ExpectedTimeBetweenSteps.count()
                              << std::endl;
                }
            }
            m_Profiler.Stop("BS_WaitOnAsync");
        }
    }

    if (m_Parameters.BufferVType == (int)BufferVType::MallocVType)
    {
        m_BP5Serializer.InitStep(new MallocV(
            "BP5Writer", false, m_BP5Serializer.m_BufferAlign, m_BP5Serializer.m_BufferBlockSize,
            m_Parameters.InitialBufferSize, m_Parameters.GrowthFactor));
    }
    else
    {
        m_BP5Serializer.InitStep(new ChunkV("BP5Writer", false, m_BP5Serializer.m_BufferAlign,
                                            m_BP5Serializer.m_BufferBlockSize,
                                            m_Parameters.BufferChunkSize));
    }
    m_ThisTimestepDataSize = 0;

    ts = Now() - m_EngineStart;
    // std::cout << "BEGIN STEP ended at: " << ts.count() << std::endl;
    return StepStatus::OK;
}